

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
NodeSet::topological_order(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NodeSet *this)

{
  bool bVar1;
  size_type __n;
  reference ppVar2;
  reference pvVar3;
  pair<const_std::vector<int,_std::allocator<int>_>,_int> *kvpair;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *__range1;
  int pos;
  allocator<int> local_1a;
  undefined1 local_19;
  NodeSet *local_18;
  NodeSet *this_local;
  vector<int,_std::allocator<int>_> *ord;
  
  local_19 = 0;
  local_18 = this;
  this_local = (NodeSet *)__return_storage_ptr__;
  __n = std::
        map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::size(&this->index);
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  __range1._0_4_ = 0;
  __end1 = std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::begin(&this->index);
  kvpair = (pair<const_std::vector<int,_std::allocator<int>_>,_int> *)
           std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::end(&this->index);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&kvpair), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>
             ::operator*(&__end1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)ppVar2->second);
    *pvVar3 = (int)__range1;
    std::_Rb_tree_const_iterator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>::
    operator++(&__end1);
    __range1._0_4_ = (int)__range1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> NodeSet::topological_order() const {
	std::vector<int> ord(index.size());
	int pos = 0;
	for (const auto &kvpair : index) {
		ord[kvpair.second] = pos++;
	}
	return ord;
}